

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_encoder.c
# Opt level: O3

lzma_ret lzma_block_encoder_init
                   (lzma_next_coder_conflict11 *next,lzma_allocator *allocator,lzma_block *block)

{
  lzma_bool lVar1;
  lzma_ret lVar2;
  lzma_coder_conflict12 *plVar3;
  lzma_check type;
  
  if ((code *)next->init != lzma_block_encoder_init) {
    lzma_next_end((lzma_next_coder *)next,allocator);
  }
  next->init = (uintptr_t)lzma_block_encoder_init;
  lVar2 = LZMA_PROG_ERROR;
  if ((block != (lzma_block *)0x0) && (lVar2 = LZMA_OPTIONS_ERROR, block->version == 0)) {
    type = block->check;
    lVar2 = LZMA_PROG_ERROR;
    if (type < 0x10) {
      lVar1 = lzma_check_is_supported(type);
      if (lVar1 != '\0') {
        plVar3 = next->coder;
        if (plVar3 == (lzma_coder_conflict12 *)0x0) {
          plVar3 = (lzma_coder_conflict12 *)lzma_alloc(0xd0,allocator);
          next->coder = plVar3;
          if (plVar3 == (lzma_coder_conflict12 *)0x0) {
            return LZMA_MEM_ERROR;
          }
          next->code = block_encode;
          next->end = block_encoder_end;
          next->update = block_encoder_update;
          (plVar3->next).memconfig =
               (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict11 *)0x0;
          (plVar3->next).update =
               (_func_lzma_ret_lzma_coder_ptr_lzma_allocator_ptr_lzma_filter_ptr_lzma_filter_ptr_conflict11
                *)0x0;
          (plVar3->next).end = (lzma_end_function_conflict10)0x0;
          (plVar3->next).get_check = (_func_lzma_check_lzma_coder_ptr_conflict11 *)0x0;
          (plVar3->next).init = 0;
          (plVar3->next).code = (lzma_code_function_conflict10)0x0;
          (plVar3->next).coder = (lzma_coder_conflict12 *)0x0;
          (plVar3->next).id = 0xffffffffffffffff;
          type = block->check;
        }
        plVar3->sequence = SEQ_CODE;
        plVar3->block = block;
        plVar3->compressed_size = 0;
        plVar3->uncompressed_size = 0;
        plVar3->pos = 0;
        lzma_check_init(&plVar3->check,type);
        lVar2 = lzma_raw_encoder_init((lzma_next_coder *)next->coder,allocator,block->filters);
        return lVar2;
      }
      lVar2 = LZMA_UNSUPPORTED_CHECK;
    }
  }
  return lVar2;
}

Assistant:

extern lzma_ret
lzma_block_encoder_init(lzma_next_coder *next, lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_encoder_init, next, allocator);

	if (block == NULL)
		return LZMA_PROG_ERROR;

	// The contents of the structure may depend on the version so
	// check the version first.
	if (block->version != 0)
		return LZMA_OPTIONS_ERROR;

	// If the Check ID is not supported, we cannot calculate the check and
	// thus not create a proper Block.
	if ((unsigned int)(block->check) > LZMA_CHECK_ID_MAX)
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(block->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Allocate and initialize *next->coder if needed.
	if (next->coder == NULL) {
		next->coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (next->coder == NULL)
			return LZMA_MEM_ERROR;

		next->code = &block_encode;
		next->end = &block_encoder_end;
		next->update = &block_encoder_update;
		next->coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	next->coder->sequence = SEQ_CODE;
	next->coder->block = block;
	next->coder->compressed_size = 0;
	next->coder->uncompressed_size = 0;
	next->coder->pos = 0;

	// Initialize the check
	lzma_check_init(&next->coder->check, block->check);

	// Initialize the requested filters.
	return lzma_raw_encoder_init(&next->coder->next, allocator,
			block->filters);
}